

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

FuncValue * __thiscall
asmjit::v1_14::FuncDetail::arg(FuncDetail *this,size_t argIndex,size_t valueIndex)

{
  FuncValue *pFVar1;
  ulong in_RSI;
  FuncValuePack *in_RDI;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  size_t in_stack_ffffffffffffffd8;
  
  if (0x1f < in_RSI) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  pFVar1 = FuncValuePack::operator[](in_RDI,in_stack_ffffffffffffffd8);
  return pFVar1;
}

Assistant:

inline const FuncValue& arg(size_t argIndex, size_t valueIndex = 0) const noexcept {
    ASMJIT_ASSERT(argIndex < Globals::kMaxFuncArgs);
    return _args[argIndex][valueIndex];
  }